

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O2

void __thiscall slang::ast::EvalContext::reportStack(EvalContext *this,Diagnostic *diag)

{
  uint uVar1;
  ulong uVar2;
  Diagnostic *this_00;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  pointer pFVar6;
  FormatBuffer buffer;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> local_250;
  undefined1 local_38;
  
  uVar2 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.len;
  uVar1 = (((this->astCtx).scope.ptr)->compilation->options).maxConstexprBacktrace;
  uVar3 = (ulong)uVar1;
  if (uVar3 == 0 || uVar2 <= uVar3) {
    local_250.super_buffer<char>.ptr_ = local_250.store_;
    local_250.super_buffer<char>.size_ = 0;
    local_250.super_buffer<char>.grow_ =
         ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
    local_250.super_buffer<char>.capacity_ = 500;
    local_38 = 0;
    pFVar6 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_;
    for (lVar5 = uVar2 * 0x50; lVar5 != 0; lVar5 = lVar5 + -0x50) {
      reportFrame(diag,(Frame *)(&pFVar6[-1].temporaries._M_t._M_impl.field_0x0 + lVar5));
    }
    ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::deallocate
              (&local_250);
  }
  else {
    uVar4 = (ulong)(uVar1 >> 1);
    pFVar6 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ + uVar2;
    for (lVar5 = uVar4 * -0x50; pFVar6 = pFVar6 + -1, lVar5 != 0; lVar5 = lVar5 + 0x50) {
      reportFrame(diag,pFVar6);
    }
    this_00 = Diagnostic::addNote(diag,(DiagCode)0x21000c,
                                  (this->stack).
                                  super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_
                                  [(this->stack).
                                   super_SmallVectorBase<slang::ast::EvalContext::Frame>.len +
                                   (-1 - uVar4)].callLocation);
    Diagnostic::operator<<<unsigned_long>
              (this_00,(this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.len -
                       uVar3);
    pFVar6 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_;
    for (lVar5 = (ulong)(uVar1 & 1) * 0x50 + uVar4 * 0x50; lVar5 != 0; lVar5 = lVar5 + -0x50) {
      reportFrame(diag,(Frame *)(&pFVar6[-1].temporaries._M_t._M_impl.field_0x0 + lVar5));
    }
  }
  return;
}

Assistant:

void EvalContext::reportStack(Diagnostic& diag) const {
    const size_t limit = getCompilation().getOptions().maxConstexprBacktrace;
    if (stack.size() <= limit || limit == 0) {
        FormatBuffer buffer;
        for (const Frame& frame : std::views::reverse(stack))
            reportFrame(diag, frame);
        return;
    }

    const ptrdiff_t start = ptrdiff_t(limit / 2);
    const ptrdiff_t end = start + ptrdiff_t(limit % 2);
    auto reversed = std::views::reverse(stack);
    for (auto it = reversed.begin(), itEnd = it + start; it != itEnd; it++)
        reportFrame(diag, *it);

    diag.addNote(diag::NoteSkippingFrames, (reversed.begin() + start)->callLocation)
        << stack.size() - limit;

    for (auto it = reversed.end() - end, itEnd = reversed.end(); it != itEnd; it++)
        reportFrame(diag, *it);
}